

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenInitializer.cxx
# Opt level: O3

void __thiscall cmQtAutoGenInitializer::InfoWriter::WriteUInt(InfoWriter *this,char *key,uint value)

{
  size_t sVar1;
  ostream *poVar2;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,"set(",4);
  if (key == (char *)0x0) {
    std::ios::clear((int)this +
                    (int)(this->Ofs_).super_ofstream.
                         super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream[-3])
    ;
  }
  else {
    sVar1 = strlen(key);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this,key,sVar1);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this," ",1);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)this);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,")\n",2);
  return;
}

Assistant:

void cmQtAutoGenInitializer::InfoWriter::WriteUInt(const char* key,
                                                   unsigned int value)
{
  Ofs_ << "set(" << key << " " << value << ")\n";
}